

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O3

void __thiscall
SlotCreateUpdateForm::SlotCreateUpdateForm
          (SlotCreateUpdateForm *this,Professor *requestedBy,Room *room,DateTime *startTime,
          DateTime *endTime,char *passedReason,int approved,Slot *passedInstance)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  undefined7 uVar8;
  
  (this->super_ModelForm<Slot>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ModelForm<Slot>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ModelForm<Slot>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ModelForm<Slot>).instance = (Slot *)0x0;
  (this->super_ModelForm<Slot>).super_Form._vptr_Form = (_func_int **)&PTR_clean_0012c598;
  (this->requestedBy).super_BaseUser.super_Model<BaseUser>.id =
       (requestedBy->super_BaseUser).super_Model<BaseUser>.id;
  (this->requestedBy).super_BaseUser.super_Model<BaseUser>._vptr_Model =
       (_func_int **)&PTR_save_0012bef8;
  memcpy(&(this->requestedBy).super_BaseUser.super_Model<BaseUser>.field_0xc,
         &(requestedBy->super_BaseUser).super_Model<BaseUser>.field_0xc,0xe1);
  (this->requestedBy).super_BaseUser.super_Model<BaseUser>._vptr_Model =
       (_func_int **)&PTR_save_0012bf18;
  (this->room).super_Model<Room>.id = (room->super_Model<Room>).id;
  (this->room).super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012c2e0;
  bVar1 = room->video;
  (this->room).audio = room->audio;
  (this->room).video = bVar1;
  *(undefined8 *)&(this->room).super_Model<Room>.field_0xc =
       *(undefined8 *)&(room->super_Model<Room>).field_0xc;
  iVar2 = startTime->month;
  iVar3 = startTime->year;
  iVar4 = startTime->hour;
  iVar5 = startTime->minute;
  iVar6 = startTime->second;
  cVar7 = startTime->meridy;
  uVar8 = *(undefined7 *)&startTime->field_0x19;
  (this->startTime).date = startTime->date;
  (this->startTime).month = iVar2;
  (this->startTime).year = iVar3;
  (this->startTime).hour = iVar4;
  (this->startTime).minute = iVar5;
  (this->startTime).second = iVar6;
  (this->startTime).meridy = cVar7;
  *(undefined7 *)&(this->startTime).field_0x19 = uVar8;
  (this->startTime).value = startTime->value;
  iVar2 = endTime->month;
  iVar3 = endTime->year;
  iVar4 = endTime->hour;
  iVar5 = endTime->minute;
  iVar6 = endTime->second;
  cVar7 = endTime->meridy;
  uVar8 = *(undefined7 *)&endTime->field_0x19;
  (this->endTime).date = endTime->date;
  (this->endTime).month = iVar2;
  (this->endTime).year = iVar3;
  (this->endTime).hour = iVar4;
  (this->endTime).minute = iVar5;
  (this->endTime).second = iVar6;
  (this->endTime).meridy = cVar7;
  *(undefined7 *)&(this->endTime).field_0x19 = uVar8;
  (this->endTime).value = endTime->value;
  memset(this->reason,0,0x800);
  this->approved = approved;
  strcpy(this->reason,passedReason);
  (this->super_ModelForm<Slot>).instance = passedInstance;
  return;
}

Assistant:

SlotCreateUpdateForm::SlotCreateUpdateForm(const Professor &requestedBy, const Room &room, const DateTime &startTime,
                                           const DateTime &endTime, const char *passedReason, int approved,
                                           Slot *passedInstance) : requestedBy(requestedBy), room(room),
                                                                   startTime(startTime), endTime(endTime),
                                                                   approved(approved) {
    strcpy(reason, passedReason);
    instance = passedInstance;
}